

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall
Js::ScriptContext::InvalidatePropertyRecordUsageCache
          (ScriptContext *this,PropertyRecordUsageCache *propertyRecordUsageCache,Type *type)

{
  uint7 uVar1;
  bool bVar2;
  undefined8 in_RAX;
  PolymorphicInlineCache *pPVar3;
  undefined8 uStack_38;
  PropertyCacheOperationInfo info;
  
  uStack_38 = in_RAX;
  pPVar3 = PropertyRecordUsageCache::GetLdElemInlineCache(propertyRecordUsageCache);
  uVar1 = (uint7)uStack_38;
  uStack_38 = (ulong)(uVar1 & 0xffffffffff);
  bVar2 = PolymorphicInlineCache::PretendTryGetProperty
                    (pPVar3,type,(PropertyCacheOperationInfo *)((long)&uStack_38 + 5));
  if (bVar2) {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,PropertyCachePhase);
    if (bVar2) {
      Output::Print(L"PropertyRecord \'%s\' : Invalidating LdElem cache for type %p\n",
                    (propertyRecordUsageCache->propertyRecord).ptr + 1,type);
    }
    InlineCache::RemoveFromInvalidationListAndClear
              (pPVar3->inlineCaches + ((uint)((ulong)type >> 6) & pPVar3->size - 1),
               this->threadContext);
  }
  pPVar3 = PropertyRecordUsageCache::GetStElemInlineCache(propertyRecordUsageCache);
  bVar2 = PolymorphicInlineCache::PretendTrySetProperty
                    (pPVar3,type,type,(PropertyCacheOperationInfo *)((long)&uStack_38 + 5));
  if (bVar2) {
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,PropertyCachePhase);
    if (bVar2) {
      Output::Print(L"PropertyRecord \'%s\' : Invalidating StElem cache for type %p\n",
                    (propertyRecordUsageCache->propertyRecord).ptr + 1,type);
    }
    InlineCache::RemoveFromInvalidationListAndClear
              (pPVar3->inlineCaches + ((uint)((ulong)type >> 6) & pPVar3->size - 1),
               this->threadContext);
  }
  return;
}

Assistant:

void ScriptContext::InvalidatePropertyRecordUsageCache(PropertyRecordUsageCache* propertyRecordUsageCache, Type *type)
    {
        PolymorphicInlineCache * cache = propertyRecordUsageCache->GetLdElemInlineCache();
        PropertyCacheOperationInfo info;
        if (cache->PretendTryGetProperty(type, &info))
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (PHASE_TRACE1(PropertyCachePhase))
            {
                Output::Print(_u("PropertyRecord '%s' : Invalidating LdElem cache for type %p\n"), propertyRecordUsageCache->GetString(), type);
            }
#endif
            cache->GetInlineCaches()[cache->GetInlineCacheIndexForType(type)].RemoveFromInvalidationListAndClear(this->GetThreadContext());
        }
        cache = propertyRecordUsageCache->GetStElemInlineCache();
        if (cache->PretendTrySetProperty(type, type, &info))
        {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
            if (PHASE_TRACE1(PropertyCachePhase))
            {
                Output::Print(_u("PropertyRecord '%s' : Invalidating StElem cache for type %p\n"), propertyRecordUsageCache->GetString(), type);
            }
#endif
            cache->GetInlineCaches()[cache->GetInlineCacheIndexForType(type)].RemoveFromInvalidationListAndClear(this->GetThreadContext());
        }
    }